

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O2

Test * DyndepParserTestBlankLineVersionCRLF::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x218);
  DyndepParserTestBlankLineVersionCRLF((DyndepParserTestBlankLineVersionCRLF *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(DyndepParserTest, BlankLineVersionCRLF) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"\r\n"
"ninja_dyndep_version = 1\r\n"));
}